

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal_ports.cpp
# Opt level: O3

void __thiscall sc_core::sc_inout<sc_dt::sc_logic>::remove_traces(sc_inout<sc_dt::sc_logic> *this)

{
  sc_trace_params *psVar1;
  pointer pcVar2;
  pointer ppsVar3;
  bool bVar4;
  uint uVar5;
  sc_trace_params_vec *psVar6;
  long lVar7;
  long lVar8;
  
  psVar6 = this->m_traces;
  if (psVar6 == (sc_trace_params_vec *)0x0) {
    return;
  }
  uVar5 = (int)((ulong)((long)(psVar6->
                              super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(psVar6->
                             super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
  if (-1 < (int)uVar5) {
    lVar7 = (ulong)uVar5 + 1;
    do {
      psVar1 = (this->m_traces->
               super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
               )._M_impl.super__Vector_impl_data._M_start[lVar7 + -1];
      if ((psVar1 != (sc_trace_params *)0x0) &&
         (pcVar2 = (psVar1->name)._M_dataplus._M_p,
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar2 != &(psVar1->name).field_2)) {
        operator_delete(pcVar2);
      }
      operator_delete(psVar1);
      lVar8 = lVar7 + -1;
      bVar4 = 0 < lVar7;
      lVar7 = lVar8;
    } while (lVar8 != 0 && bVar4);
    psVar6 = this->m_traces;
    if (psVar6 == (sc_trace_params_vec *)0x0) {
      psVar6 = (sc_trace_params_vec *)0x0;
      goto LAB_001a89d0;
    }
  }
  ppsVar3 = (psVar6->
            super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (ppsVar3 != (pointer)0x0) {
    operator_delete(ppsVar3);
  }
LAB_001a89d0:
  operator_delete(psVar6);
  this->m_traces = (sc_trace_params_vec *)0x0;
  return;
}

Assistant:

void
sc_inout<sc_dt::sc_logic>::remove_traces() const
{
    if( m_traces != 0 ) {
	for( int i = m_traces->size() - 1; i >= 0; -- i ) {
	    delete (*m_traces)[i];
	}
	delete m_traces;
	m_traces = 0;
    }
}